

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ClampWindowRect(ImGuiWindow *window,ImRect *rect,ImVec2 *padding)

{
  long in_RDI;
  float _y;
  ImVec2 IVar1;
  ImVec2 size_for_clamping;
  ImGuiContext *g;
  ImVec2 *in_stack_ffffffffffffff98;
  ImVec2 *lhs;
  undefined4 in_stack_ffffffffffffffa0;
  float in_stack_ffffffffffffffa4;
  ImGuiWindow *in_stack_ffffffffffffffb0;
  ImVec2 local_28;
  ImGuiContext *local_20;
  long local_8;
  
  local_20 = GImGui;
  local_8 = in_RDI;
  if ((((GImGui->IO).ConfigWindowsMoveFromTitleBarOnly & 1U) == 0) ||
     ((*(uint *)(in_RDI + 0xc) & 1) != 0)) {
    local_28 = *(ImVec2 *)(in_RDI + 0x18);
  }
  else {
    in_stack_ffffffffffffffa4 = *(float *)(in_RDI + 0x18);
    _y = ImGuiWindow::TitleBarHeight(in_stack_ffffffffffffffb0);
    ImVec2::ImVec2(&local_28,in_stack_ffffffffffffffa4,_y);
  }
  operator-(in_stack_ffffffffffffff98,(ImVec2 *)0x1f8e8d);
  lhs = &local_28;
  operator+(lhs,(ImVec2 *)0x1f8eaa);
  IVar1 = operator+(lhs,(ImVec2 *)0x1f8ebf);
  ImMax((ImVec2 *)IVar1,(ImVec2 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  operator-(lhs,(ImVec2 *)0x1f8ee8);
  IVar1 = ImMin((ImVec2 *)IVar1,
                (ImVec2 *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
  *(ImVec2 *)(local_8 + 0x10) = IVar1;
  return;
}

Assistant:

static inline void ClampWindowRect(ImGuiWindow* window, const ImRect& rect, const ImVec2& padding)
{
    ImGuiContext& g = *GImGui;
    ImVec2 size_for_clamping = (g.IO.ConfigWindowsMoveFromTitleBarOnly && !(window->Flags & ImGuiWindowFlags_NoTitleBar)) ? ImVec2(window->Size.x, window->TitleBarHeight()) : window->Size;
    window->Pos = ImMin(rect.Max - padding, ImMax(window->Pos + size_for_clamping, rect.Min + padding) - size_for_clamping);
}